

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ReportError
          (ParserImpl *this,int line,int col,string *message)

{
  LogMessage *pLVar1;
  string *psVar2;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [13];
  LogMessage local_58;
  string *local_20;
  string *message_local;
  int col_local;
  int line_local;
  ParserImpl *this_local;
  
  this->had_errors_ = true;
  local_20 = message;
  message_local._0_4_ = col;
  message_local._4_4_ = line;
  _col_local = this;
  if (this->error_collector_ == (ErrorCollector *)0x0) {
    if (line < 0) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/text_format.cc"
                 ,0xfa);
      pLVar1 = internal::LogMessage::operator<<(&local_a0,"Error parsing text-format ");
      psVar2 = Descriptor::full_name_abi_cxx11_(this->root_message_type_);
      pLVar1 = internal::LogMessage::operator<<(pLVar1,psVar2);
      pLVar1 = internal::LogMessage::operator<<(pLVar1,": ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,local_20);
      internal::LogFinisher::operator=(&local_a1,pLVar1);
      internal::LogMessage::~LogMessage(&local_a0);
    }
    else {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/text_format.cc"
                 ,0xf5);
      pLVar1 = internal::LogMessage::operator<<(&local_58,"Error parsing text-format ");
      psVar2 = Descriptor::full_name_abi_cxx11_(this->root_message_type_);
      pLVar1 = internal::LogMessage::operator<<(pLVar1,psVar2);
      pLVar1 = internal::LogMessage::operator<<(pLVar1,": ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,message_local._4_4_ + 1);
      pLVar1 = internal::LogMessage::operator<<(pLVar1,":");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,(int)message_local + 1);
      pLVar1 = internal::LogMessage::operator<<(pLVar1,": ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,local_20);
      internal::LogFinisher::operator=(local_65,pLVar1);
      internal::LogMessage::~LogMessage(&local_58);
    }
  }
  else {
    (*this->error_collector_->_vptr_ErrorCollector[2])
              (this->error_collector_,(ulong)(uint)line,(ulong)(uint)col,message);
  }
  return;
}

Assistant:

void ReportError(int line, int col, const string& message) {
    had_errors_ = true;
    if (error_collector_ == NULL) {
      if (line >= 0) {
        GOOGLE_LOG(ERROR) << "Error parsing text-format "
                   << root_message_type_->full_name()
                   << ": " << (line + 1) << ":"
                   << (col + 1) << ": " << message;
      } else {
        GOOGLE_LOG(ERROR) << "Error parsing text-format "
                   << root_message_type_->full_name()
                   << ": " << message;
      }
    } else {
      error_collector_->AddError(line, col, message);
    }
  }